

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_get_var_value(sat_solver *s,int v)

{
  int iVar1;
  int v_local;
  sat_solver *s_local;
  
  iVar1 = var_value(s,v);
  if (iVar1 == 1) {
    s_local._4_4_ = -1;
  }
  else {
    iVar1 = var_value(s,v);
    if (iVar1 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      iVar1 = var_value(s,v);
      if (iVar1 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x7d,"int sat_solver_get_var_value(sat_solver *, int)");
      }
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_get_var_value(sat_solver* s, int v)
{
    if ( var_value(s, v) == var0 )
        return l_False;
    if ( var_value(s, v) == var1 )
        return l_True;
    if ( var_value(s, v) == varX )
        return l_Undef;
    assert( 0 );
    return 0;
}